

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O2

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *gmesh,ofstream *file,TPZVec<double> *elData)

{
  long lVar1;
  TPZGeoEl *gel;
  char cVar2;
  int iVar3;
  MElementType elType;
  ostream *poVar4;
  TPZGeoEl **ppTVar5;
  int64_t iVar6;
  TPZGeoNode *this;
  int iVar7;
  long lVar8;
  int c;
  REAL RVar9;
  string local_b50 [32];
  int64_t local_b30;
  long local_b28;
  long local_b20;
  int local_b14;
  TPZVec<double> *local_b10;
  ofstream *local_b08;
  long local_b00;
  TPZChunkVector<TPZGeoEl_*,_10> *local_af8;
  long local_af0;
  stringstream connectivity;
  ostream local_ad8 [376];
  stringstream index;
  undefined1 local_950 [376];
  stringstream eldim;
  undefined1 local_7c8 [376];
  stringstream eldat;
  stringstream material;
  undefined1 local_4b8 [376];
  stringstream type;
  undefined1 local_330 [376];
  stringstream node;
  ostream local_1a8 [376];
  
  local_b10 = elData;
  if ((gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements != elData->fNElements) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Wrong vector size of elements data!");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"See ");
    poVar4 = std::operator<<(poVar4,
                             "static void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *, std::ofstream &, TPZVec<REAL> &)"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  lVar1 = (gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  std::__cxx11::stringstream::stringstream((stringstream *)&node);
  std::__cxx11::stringstream::stringstream((stringstream *)&connectivity);
  std::__cxx11::stringstream::stringstream((stringstream *)&type);
  std::__cxx11::stringstream::stringstream((stringstream *)&material);
  std::__cxx11::stringstream::stringstream((stringstream *)&eldat);
  std::__cxx11::stringstream::stringstream((stringstream *)&eldim);
  std::__cxx11::stringstream::stringstream((stringstream *)&index);
  poVar4 = std::operator<<((ostream *)file,"# vtk DataFile Version 3.0");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)file,"TPZGeoMesh VTK Visualization");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)file,"ASCII");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)file,"DATASET UNSTRUCTURED_GRID");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)file,"POINTS ");
  local_af8 = &(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
  lVar8 = 0;
  local_af0 = lVar1;
  if (lVar1 < 1) {
    local_af0 = lVar8;
  }
  local_b20 = -1;
  local_b28 = 0;
  iVar6 = 0;
  local_b08 = file;
  while (iVar6 != local_af0) {
    local_b30 = iVar6;
    ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_af8,iVar6);
    gel = *ppTVar5;
    if (((gel != (TPZGeoEl *)0x0) &&
        ((iVar3 = (**(code **)(*(long *)gel + 0xb8))(gel), iVar3 != 1 ||
         (cVar2 = (**(code **)(*(long *)gel + 0xd0))(gel), cVar2 != '\0')))) &&
       ((local_b10->fStore[local_b30] != -999.0 || (NAN(local_b10->fStore[local_b30]))))) {
      elType = (**(code **)(*(long *)gel + 0xb8))(gel);
      local_b00 = lVar8;
      iVar3 = MElementType_NNodes(elType);
      std::ostream::operator<<(local_ad8,iVar3);
      local_b28 = local_b28 + iVar3 + 1;
      iVar7 = 0;
      local_b14 = iVar3;
      if (iVar3 < 1) {
        local_b14 = 0;
      }
      for (; iVar7 != local_b14; iVar7 = iVar7 + 1) {
        for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
          iVar6 = (**(code **)(*(long *)gel + 0xa8))(gel,iVar7);
          this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,iVar6);
          RVar9 = TPZGeoNode::Coord(this,iVar3);
          poVar4 = std::ostream::_M_insert<double>(RVar9);
          std::operator<<(poVar4," ");
        }
        std::endl<char,std::char_traits<char>>(local_1a8);
        poVar4 = std::operator<<(local_ad8," ");
        local_b20 = local_b20 + 1;
        std::ostream::_M_insert<long>((long)poVar4);
      }
      std::endl<char,std::char_traits<char>>(local_ad8);
      iVar3 = GetVTK_ElType(gel);
      lVar8 = local_b00;
      file = local_b08;
      poVar4 = (ostream *)std::ostream::operator<<(local_330,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<double>(local_b10->fStore[local_b30]);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = (ostream *)std::ostream::operator<<(local_4b8,gel->fMatId);
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar3 = (**(code **)(*(long *)gel + 0x210))(gel);
      poVar4 = (ostream *)std::ostream::operator<<(local_7c8,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<long>((long)local_950);
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar8 = lVar8 + 1;
    }
    iVar6 = local_b30 + 1;
  }
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar4 = std::ostream::_M_insert<long>((long)file);
  poVar4 = std::operator<<(poVar4," float");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar4,local_b50);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"CELLS ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)file);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  poVar4 = std::operator<<((ostream *)file,local_b50);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"CELL_TYPES ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  poVar4 = std::operator<<((ostream *)file,local_b50);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"CELL_DATA");
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)file,"FIELD FieldData 4");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)file,"ElData 1 ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," float");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)file,local_b50);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"Material 1 ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," int");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)file,local_b50);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"Dimension 1 ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," int");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)file,local_b50);
  std::__cxx11::string::~string(local_b50);
  poVar4 = std::operator<<((ostream *)file,"elIndex 1 ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," int");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)file,local_b50);
  std::__cxx11::string::~string(local_b50);
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream((stringstream *)&index);
  std::__cxx11::stringstream::~stringstream((stringstream *)&eldim);
  std::__cxx11::stringstream::~stringstream((stringstream *)&eldat);
  std::__cxx11::stringstream::~stringstream((stringstream *)&material);
  std::__cxx11::stringstream::~stringstream((stringstream *)&type);
  std::__cxx11::stringstream::~stringstream((stringstream *)&connectivity);
  std::__cxx11::stringstream::~stringstream((stringstream *)&node);
  return;
}

Assistant:

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh * gmesh, std::ofstream &file, TPZVec<REAL> &elData) {
    if (gmesh->NElements() != elData.NElements()) {
        std::cout << "Wrong vector size of elements data!" << std::endl;
        std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
    }
    file.clear();
    int64_t nelements = gmesh->NElements();

    std::stringstream node, connectivity, type, material, eldat, eldim, index;

    //Header
    file << "# vtk DataFile Version 3.0" << std::endl;
    file << "TPZGeoMesh VTK Visualization" << std::endl;
    file << "ASCII" << std::endl << std::endl;

    file << "DATASET UNSTRUCTURED_GRID" << std::endl;
    file << "POINTS ";

    int64_t actualNode = -1, size = 0, nVALIDelements = 0;
    TPZGeoEl *gel;

    for (int64_t el = 0; el < nelements; el++) {
        gel = gmesh->ElementVec()[el];
        if (!gel || (gel->Type() == EOned && !gel->IsLinearMapping()))//Exclude Arc3D and Ellipse3D
        {
            continue;
        }
        if (elData[el] == -999.) {
            continue;
        }

        MElementType elt = gel->Type();
        int elNnodes = MElementType_NNodes(elt);

        size += (1 + elNnodes);
        connectivity << elNnodes;

        for (int t = 0; t < elNnodes; t++) {
            for (int c = 0; c < 3; c++) {
                double coord = gmesh->NodeVec()[gel->NodeIndex(t)].Coord(c);
                node << coord << " ";
            }
            node << std::endl;

            actualNode++;
            connectivity << " " << actualNode;
        }
        connectivity << std::endl;

        int elType = TPZVTKGeoMesh::GetVTK_ElType(gel);
        type << elType << std::endl;

        eldat  << elData[el] << std::endl;
        material << gel->MaterialId() << std::endl;
        eldim << gel->Dimension() << std::endl;


        index << gel->Index() << std::endl;

        nVALIDelements++;
    }
    node << std::endl;
    actualNode++;
    file << actualNode << " float" << std::endl << node.str();

    file << "CELLS " << nVALIDelements << " ";

    file << size << std::endl;
    file << connectivity.str() << std::endl;

    file << "CELL_TYPES " << nVALIDelements << std::endl;
    file << type.str() << std::endl;

    file << "CELL_DATA" << " " << nVALIDelements << std::endl;
    file << "FIELD FieldData 4" << std::endl;

    file << "ElData 1 " << nVALIDelements << " float" << std::endl;
    file << eldat.str();

    file << "Material 1 " << nVALIDelements << " int" << std::endl;
    file << material.str();

    file << "Dimension 1 " << nVALIDelements << " int" << std::endl;
    file << eldim.str();

    file << "elIndex 1 " << nVALIDelements << " int" << std::endl;
    file << index.str();

    file.close();
}